

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O2

void method_getArgumentType(Method method,uint index,char *dst,size_t dst_len)

{
  char *pcVar1;
  size_t __n;
  
  if (method != (Method)0x0) {
    pcVar1 = method_getTypeEncoding(method);
    pcVar1 = findParameterStart(pcVar1,index);
    if (pcVar1 == (char *)0x0) {
      if (dst_len != 0) {
        *dst = '\0';
      }
    }
    else {
      __n = lengthOfTypeEncoding(pcVar1);
      if (dst_len <= __n) {
        memcpy(dst,pcVar1,dst_len);
        return;
      }
      memcpy(dst,pcVar1,__n);
      dst[__n] = '\0';
    }
  }
  return;
}

Assistant:

OBJC_PUBLIC
void method_getArgumentType(Method method,
                            unsigned int index,
                            char *dst,
                            size_t dst_len)
{
	if (NULL == method) { return; }
	const char *types = findParameterStart(method_getTypeEncoding(method), index);
	if (NULL == types)
	{
		if (dst_len > 0)
		{
			*dst = '\0';
		}
		return;
	}
	size_t length = lengthOfTypeEncoding(types);
	if (length < dst_len)
	{
		memcpy(dst, types, length);
		dst[length] = '\0';
	}
	else
	{
		memcpy(dst, types, dst_len);
	}
}